

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void __thiscall tetgenmesh::constraineddelaunay(tetgenmesh *this,clock_t *tv)

{
  arraypool *paVar1;
  char *pcVar2;
  unsigned_long uVar3;
  long lVar4;
  shellface *pppdVar5;
  clock_t cVar6;
  long lVar7;
  tetgenmesh *ptVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  face *paryseg;
  face *parysh;
  char *local_50;
  char *local_48;
  long local_40;
  long local_38;
  
  if (this->b->quiet == 0) {
    puts("Constrained Delaunay...");
  }
  makesegmentendpointsmap(this);
  makefacetverticesmap(this);
  if (this->b->verbose != 0) {
    puts("  Delaunizing segments.");
  }
  this->checksubsegflag = 1;
  memorypool::traversalinit(this->subsegs);
  lVar11 = 0;
  while (lVar11 < this->subsegs->items) {
    lVar11 = lVar11 + 1;
    uVar3 = randomnation(this,(uint)lVar11);
    ptVar8 = (tetgenmesh *)this->subsegstack;
    arraypool::newindex((arraypool *)ptVar8,&local_50);
    paVar1 = this->subsegstack;
    uVar9 = (uint)uVar3;
    pcVar2 = paVar1->toparray[(int)uVar9 >> ((byte)paVar1->log2objectsperblock & 0x1f)];
    lVar4 = (long)paVar1->objectbytes * (long)(int)(paVar1->objectsperblockmark & uVar9);
    *(undefined8 *)local_50 = *(undefined8 *)(pcVar2 + lVar4);
    *(undefined4 *)(local_50 + 8) = *(undefined4 *)(pcVar2 + lVar4 + 8);
    pppdVar5 = shellfacetraverse(ptVar8,this->subsegs);
    paVar1 = this->subsegstack;
    pcVar2 = paVar1->toparray[(int)uVar9 >> ((byte)paVar1->log2objectsperblock & 0x1f)];
    lVar4 = (long)paVar1->objectbytes * (long)(int)(uVar9 & paVar1->objectsperblockmark);
    local_50 = pcVar2 + lVar4;
    *(shellface **)(pcVar2 + lVar4) = pppdVar5;
    pcVar2 = pcVar2 + lVar4 + 8;
    pcVar2[0] = '\0';
    pcVar2[1] = '\0';
    pcVar2[2] = '\0';
    pcVar2[3] = '\0';
  }
  delaunizesegments(this);
  if (this->b->verbose != 0) {
    printf("  Inserted %ld Steiner points.\n",this->st_segref_count);
  }
  cVar6 = clock();
  *tv = cVar6;
  if (this->b->verbose != 0) {
    puts("  Constraining facets.");
  }
  this->checksubfaceflag = 1;
  lVar11 = this->fillregioncount;
  lVar4 = this->cavitycount;
  local_40 = this->cavityexpcount;
  local_38 = this->st_segref_count;
  memorypool::traversalinit(this->subfaces);
  lVar10 = 0;
  while (lVar10 < this->subfaces->items) {
    lVar10 = lVar10 + 1;
    uVar3 = randomnation(this,(uint)lVar10);
    ptVar8 = (tetgenmesh *)this->subfacstack;
    arraypool::newindex((arraypool *)ptVar8,&local_48);
    paVar1 = this->subfacstack;
    uVar9 = (uint)uVar3;
    pcVar2 = paVar1->toparray[(int)uVar9 >> ((byte)paVar1->log2objectsperblock & 0x1f)];
    lVar7 = (long)paVar1->objectbytes * (long)(int)(paVar1->objectsperblockmark & uVar9);
    *(undefined8 *)local_48 = *(undefined8 *)(pcVar2 + lVar7);
    *(undefined4 *)(local_48 + 8) = *(undefined4 *)(pcVar2 + lVar7 + 8);
    pppdVar5 = shellfacetraverse(ptVar8,this->subfaces);
    paVar1 = this->subfacstack;
    pcVar2 = paVar1->toparray[(int)uVar9 >> ((byte)paVar1->log2objectsperblock & 0x1f)];
    lVar7 = (long)paVar1->objectbytes * (long)(int)(uVar9 & paVar1->objectsperblockmark);
    local_48 = pcVar2 + lVar7;
    *(shellface **)(pcVar2 + lVar7) = pppdVar5;
    pcVar2 = pcVar2 + lVar7 + 8;
    pcVar2[0] = '\0';
    pcVar2[1] = '\0';
    pcVar2[2] = '\0';
    pcVar2[3] = '\0';
  }
  constrainedfacets(this);
  if (this->b->verbose != 0) {
    if (lVar11 < this->fillregioncount) {
      printf("  Remeshed %ld regions.\n");
    }
    if (lVar4 < this->cavitycount) {
      printf("  Remeshed %ld cavities");
      if (this->cavityexpcount != local_40) {
        printf(" (%ld enlarged)");
      }
      puts(".");
    }
    if (0 < (this->st_segref_count - local_38) + this->st_facref_count) {
      printf("  Inserted %ld (%ld, %ld) refine points.\n");
      return;
    }
  }
  return;
}

Assistant:

void tetgenmesh::constraineddelaunay(clock_t& tv)
{
  face searchsh, *parysh;
  face searchseg, *paryseg;
  int s, i;

  // Statistics.
  long bakfillregioncount;
  long bakcavitycount, bakcavityexpcount;
  long bakseg_ref_count;

  if (!b->quiet) {
    printf("Constrained Delaunay...\n");
  }

  makesegmentendpointsmap();
  makefacetverticesmap();

  if (b->verbose) {
    printf("  Delaunizing segments.\n");
  }

  checksubsegflag = 1;

  // Put all segments into the list (in random order).
  subsegs->traversalinit();
  for (i = 0; i < subsegs->items; i++) {
    s = randomnation(i + 1);
    // Move the s-th seg to the i-th.
    subsegstack->newindex((void **) &paryseg);
    *paryseg = * (face *) fastlookup(subsegstack, s);
    // Put i-th seg to be the s-th.
    searchseg.sh = shellfacetraverse(subsegs);
    //sinfect(searchseg);  // Only save it once.
    paryseg = (face *) fastlookup(subsegstack, s);
    *paryseg = searchseg;
  }

  // Recover non-Delaunay segments.
  delaunizesegments();

  if (b->verbose) {
    printf("  Inserted %ld Steiner points.\n", st_segref_count); 
  }

  tv = clock();

  if (b->verbose) {
    printf("  Constraining facets.\n");
  }

  // Subfaces will be introduced.
  checksubfaceflag = 1;

  bakfillregioncount = fillregioncount;
  bakcavitycount = cavitycount;
  bakcavityexpcount = cavityexpcount;
  bakseg_ref_count = st_segref_count;

  // Randomly order the subfaces.
  subfaces->traversalinit();
  for (i = 0; i < subfaces->items; i++) {
    s = randomnation(i + 1);
    // Move the s-th subface to the i-th.
    subfacstack->newindex((void **) &parysh);
    *parysh = * (face *) fastlookup(subfacstack, s);
    // Put i-th subface to be the s-th.
    searchsh.sh = shellfacetraverse(subfaces);
    parysh = (face *) fastlookup(subfacstack, s);
    *parysh = searchsh;
  }

  // Recover facets.
  constrainedfacets();

  if (b->verbose) {
    if (fillregioncount > bakfillregioncount) {
      printf("  Remeshed %ld regions.\n", fillregioncount-bakfillregioncount);
    }
    if (cavitycount > bakcavitycount) {
      printf("  Remeshed %ld cavities", cavitycount - bakcavitycount);
      if (cavityexpcount - bakcavityexpcount) {
        printf(" (%ld enlarged)", cavityexpcount - bakcavityexpcount);
      }
      printf(".\n");
    }
    if (st_segref_count + st_facref_count - bakseg_ref_count > 0) {
      printf("  Inserted %ld (%ld, %ld) refine points.\n", 
             st_segref_count + st_facref_count - bakseg_ref_count,
             st_segref_count - bakseg_ref_count, st_facref_count);
    }
  }
}